

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_destroy(uv_stream_t *stream)

{
  uv_connect_t *puVar1;
  long lVar2;
  undefined8 *puVar3;
  uv_shutdown_t *puVar4;
  int iVar5;
  long *plVar6;
  
  iVar5 = uv__io_active(&stream->io_watcher,5);
  if (iVar5 != 0) {
    __assert_fail("!uv__io_active(&stream->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                  ,0x1b8,"void uv__stream_destroy(uv_stream_t *)");
  }
  if ((stream->flags & 2) == 0) {
    __assert_fail("stream->flags & UV_CLOSED",
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                  ,0x1b9,"void uv__stream_destroy(uv_stream_t *)");
  }
  puVar1 = stream->connect_req;
  if (puVar1 != (uv_connect_t *)0x0) {
    if (stream->loop->active_reqs == (void **)stream->loop->active_reqs[0]) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                    ,0x1bc,"void uv__stream_destroy(uv_stream_t *)");
    }
    *(void **)puVar1->active_queue[1] = puVar1->active_queue[0];
    *(void **)((long)stream->connect_req->active_queue[0] + 8) =
         stream->connect_req->active_queue[1];
    (*stream->connect_req->cb)(stream->connect_req,-0x7d);
    stream->connect_req = (uv_connect_t *)0x0;
  }
  plVar6 = (long *)stream->write_queue[0];
  if (stream->write_queue != (void **)plVar6) {
    do {
      lVar2 = *plVar6;
      *(long *)plVar6[1] = lVar2;
      *(long *)(lVar2 + 8) = plVar6[1];
      *(undefined4 *)((long)plVar6 + 0x24) = 0xffffff83;
      *plVar6 = (long)stream->write_completed_queue;
      puVar3 = (undefined8 *)stream->write_completed_queue[1];
      plVar6[1] = (long)puVar3;
      *puVar3 = plVar6;
      stream->write_completed_queue[1] = plVar6;
      plVar6 = (long *)stream->write_queue[0];
    } while (stream->write_queue != (void **)plVar6);
  }
  uv__write_callbacks(stream);
  puVar4 = stream->shutdown_req;
  if (puVar4 != (uv_shutdown_t *)0x0) {
    if (stream->loop->active_reqs == (void **)stream->loop->active_reqs[0]) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                    ,0x1ca,"void uv__stream_destroy(uv_stream_t *)");
    }
    *(void **)puVar4->active_queue[1] = puVar4->active_queue[0];
    *(void **)((long)stream->shutdown_req->active_queue[0] + 8) =
         stream->shutdown_req->active_queue[1];
    (*stream->shutdown_req->cb)(stream->shutdown_req,-0x7d);
    stream->shutdown_req = (uv_shutdown_t *)0x0;
  }
  if (stream->write_queue_size == 0) {
    return;
  }
  __assert_fail("stream->write_queue_size == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                ,0x1cf,"void uv__stream_destroy(uv_stream_t *)");
}

Assistant:

void uv__stream_destroy(uv_stream_t* stream) {
  assert(!uv__io_active(&stream->io_watcher, POLLIN | POLLOUT));
  assert(stream->flags & UV_CLOSED);

  if (stream->connect_req) {
    uv__req_unregister(stream->loop, stream->connect_req);
    stream->connect_req->cb(stream->connect_req, -ECANCELED);
    stream->connect_req = NULL;
  }

  uv__stream_flush_write_queue(stream, -ECANCELED);
  uv__write_callbacks(stream);

  if (stream->shutdown_req) {
    /* The ECANCELED error code is a lie, the shutdown(2) syscall is a
     * fait accompli at this point. Maybe we should revisit this in v0.11.
     * A possible reason for leaving it unchanged is that it informs the
     * callee that the handle has been destroyed.
     */
    uv__req_unregister(stream->loop, stream->shutdown_req);
    stream->shutdown_req->cb(stream->shutdown_req, -ECANCELED);
    stream->shutdown_req = NULL;
  }

  assert(stream->write_queue_size == 0);
}